

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dleq_impl.h
# Opt level: O0

void secp256k1_dleq_challenge_hash
               (secp256k1_scalar *e,uchar *algo16,secp256k1_ge *gen2,secp256k1_ge *r1,
               secp256k1_ge *r2,secp256k1_ge *p1,secp256k1_ge *p2)

{
  int iVar1;
  uchar local_c8 [8];
  uchar buf32 [32];
  undefined1 local_a0 [8];
  secp256k1_sha256 sha;
  secp256k1_ge *p1_local;
  secp256k1_ge *r2_local;
  secp256k1_ge *r1_local;
  secp256k1_ge *gen2_local;
  uchar *algo16_local;
  secp256k1_scalar *e_local;
  
  sha.bytes = (size_t)p1;
  iVar1 = algo16_len(algo16);
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)local_a0,algo16,(long)iVar1);
  secp256k1_dleq_hash_point((secp256k1_sha256 *)local_a0,gen2);
  secp256k1_dleq_hash_point((secp256k1_sha256 *)local_a0,r1);
  secp256k1_dleq_hash_point((secp256k1_sha256 *)local_a0,r2);
  secp256k1_dleq_hash_point((secp256k1_sha256 *)local_a0,(secp256k1_ge *)sha.bytes);
  secp256k1_dleq_hash_point((secp256k1_sha256 *)local_a0,p2);
  secp256k1_sha256_finalize((secp256k1_sha256 *)local_a0,local_c8);
  secp256k1_scalar_set_b32(e,local_c8,(int *)0x0);
  return;
}

Assistant:

static void secp256k1_dleq_challenge_hash(secp256k1_scalar *e, const unsigned char *algo16, const secp256k1_ge *gen2, const secp256k1_ge *r1, const secp256k1_ge *r2, const secp256k1_ge *p1, const secp256k1_ge *p2) {
    secp256k1_sha256 sha;
    unsigned char buf32[32];

    secp256k1_sha256_initialize_tagged(&sha, algo16, algo16_len(algo16));
    secp256k1_dleq_hash_point(&sha, gen2);
    secp256k1_dleq_hash_point(&sha, r1);
    secp256k1_dleq_hash_point(&sha, r2);
    secp256k1_dleq_hash_point(&sha, p1);
    secp256k1_dleq_hash_point(&sha, p2);
    secp256k1_sha256_finalize(&sha, buf32);

    secp256k1_scalar_set_b32(e, buf32, NULL);
}